

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_port_server.cpp
# Opt level: O2

void ConnectFunc(Handle *handle,uint32_t err)

{
  int iVar1;
  ostream *poVar2;
  
  if (err == 0) {
    iVar1 = (*((handle->super___shared_ptr<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              _vptr_CNSocket[3])();
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(ushort)iVar1);
    poVar2 = std::operator<<(poVar2," port get connect socket: ");
    (*((handle->super___shared_ptr<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
      _vptr_CNSocket[2])();
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"[ConnectFunc] some thing error : ");
  }
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void ConnectFunc(Handle handle, uint32_t err) {
    if (err == CEC_SUCCESS) {
        std::cout << handle->GetListenPort() << " port get connect socket: " << handle->GetSocket() << std::endl;

    } else {
        std::cout << "[ConnectFunc] some thing error : " << err << std::endl;
    }
}